

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O2

void upgrade_v1_3_2(path *root,json *dbjson)

{
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  reference pvVar4;
  reference this;
  string_view path;
  string_view filename_00;
  string filename;
  json iterjson;
  iteration_proxy_internal iter;
  iteration_proxy_internal __begin1;
  iteration_proxy_internal __end1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_d0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  pointer local_a0;
  pointer p_Stack_98;
  pointer local_90;
  size_t local_88;
  iteration_proxy_internal local_80;
  iteration_proxy_internal local_58;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_char_(&)[6],_char[6],_0>(&local_d0,(char (*) [6])"1.5.0");
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)dbjson,"version");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_d0.m_type;
  jVar2 = pvVar4->m_value;
  pvVar4->m_value = local_d0.m_value;
  local_d0.m_type = vVar1;
  local_d0.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_d0);
  local_b0._0_8_ =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   *)dbjson,"iterators");
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::begin(&local_80,
          (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           *)local_b0);
  nlohmann::detail::
  iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::end(&local_58,
        (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         *)local_b0);
  while( true ) {
    bVar3 = nlohmann::detail::
            iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
            ::iteration_proxy_internal::operator!=(&local_80,&local_58);
    if (!bVar3) break;
    local_b0._8_8_ = local_80.anchor.m_object;
    local_90 = (pointer)local_80.anchor.m_it.primitive_iterator.m_it;
    local_a0 = (pointer)local_80.anchor.m_it.object_iterator._M_node;
    p_Stack_98 = (pointer)local_80.anchor.m_it.array_iterator._M_current;
    local_88 = local_80.array_index;
    this = nlohmann::detail::
           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)(local_b0 + 8));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_f0,this);
    path._M_str = (char *)local_f0._M_string_length;
    path._M_len = (size_t)root;
    read_json((path *)local_c0,path);
    local_100.m_value.number_integer = time((time_t *)0x0);
    local_100.m_type = number_integer;
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_c0,"last_read_timestamp");
    vVar1 = pvVar4->m_type;
    pvVar4->m_type = local_100.m_type;
    jVar2 = pvVar4->m_value;
    (pvVar4->m_value).number_integer = (number_integer_t)local_100.m_value;
    local_100.m_type = vVar1;
    local_100.m_value = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_100);
    filename_00._M_str = local_f0._M_dataplus._M_p;
    filename_00._M_len = local_f0._M_string_length;
    save_json(root,filename_00,(json *)local_c0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_c0);
    std::__cxx11::string::~string((string *)&local_f0);
    nlohmann::detail::
    iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::iteration_proxy_internal::operator++(&local_80);
  }
  return;
}

Assistant:

void upgrade_v1_3_2(const fs::path &root, json *dbjson) {
    json &db = *dbjson;
    db["version"] = "1.5.0";
    for (const auto iter : db["iterators"].items()) {
        std::string filename{iter.value()};
        json iterjson = read_json(root, filename);
        iterjson["last_read_timestamp"] = std::time(nullptr);
        save_json(root, filename, iterjson);
    }
}